

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
rebalance_or_split(btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *this,iterator *iter)

{
  field_type fVar1;
  field_type fVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  ushort uVar6;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar7;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar8;
  template_ElementType<3L> *ppbVar9;
  node_type *dest;
  ushort uVar10;
  uint to_move;
  int iVar11;
  iterator parent_iter;
  
  fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::count(iter->node);
  fVar2 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != fVar2) {
    __assert_fail("node->count() == node->max_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x82e,
                  "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::max_count(iter->node);
  if (fVar1 != '=') {
    __assert_fail("kNodeValues == node->max_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x82f,
                  "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  pbVar7 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           ::parent(iter->node);
  if (iter->node ==
      (this->root_).
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
      .value) {
    pbVar7 = new_internal_node(this,pbVar7);
    btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
    ::init_child(pbVar7,0,(this->root_).
                          super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                          .
                          super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                          .value);
    (this->root_).
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
    .
    super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
    .value = pbVar7;
    ppbVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
              ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                              *)pbVar7);
    bVar5 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::leaf(*ppbVar9);
    if ((bVar5) &&
       (ppbVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                  *)pbVar7), *ppbVar9 != this->rightmost_)) {
      __assert_fail("!parent->child(0)->leaf() || parent->child(0) == rightmost_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x87b,
                    "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
  }
  else {
    fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::position(iter->node);
    if (fVar1 != '\0') {
      bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      pbVar8 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::child(pbVar7,bVar3 - 1);
      fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::max_count(pbVar8);
      if (fVar1 != '=') {
        __assert_fail("left->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x837,
                      "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::count(pbVar8);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                ::count(pbVar8);
        uVar6 = (short)(0x3d - (ushort)bVar3) / (short)((iter->position < 0x3d) + 1);
        uVar10 = 1;
        if (1 < (short)uVar6) {
          uVar10 = uVar6;
        }
        to_move = (uint)uVar10;
        if (((int)(uint)uVar10 <= iter->position) ||
           (bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar8), bVar3 + to_move < 0x3d)) {
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::rebalance_right_to_left(pbVar8,to_move,iter->node,(allocator_type *)this);
          bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          bVar4 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::count(iter->node);
          if ((uint)bVar3 - (uint)bVar4 != to_move) {
            __assert_fail("node->max_count() - node->count() == to_move",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                          ,0x844,
                          "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                         );
          }
          iVar11 = iter->position - to_move;
          iter->position = iVar11;
          if (iVar11 < 0) {
            bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar8);
            iter->position = (uint)bVar3 + iVar11 + 1;
            iter->node = pbVar8;
          }
          else {
            pbVar8 = iter->node;
          }
          bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::count(pbVar8);
          bVar4 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x84b,
                        "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                       );
        }
      }
    }
    bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::position(iter->node);
    bVar4 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::count(pbVar7);
    if (bVar3 < bVar4) {
      bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      pbVar8 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::child(pbVar7,bVar3 + 1);
      fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::max_count(pbVar8);
      if (fVar1 != '=') {
        __assert_fail("right->max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x854,
                      "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                     );
      }
      bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::count(pbVar8);
      if (bVar3 < 0x3d) {
        bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                ::count(pbVar8);
        iVar11 = iter->position;
        uVar6 = (short)(0x3d - (ushort)bVar3) / (short)((0 < iVar11) + 1);
        uVar10 = 1;
        if (1 < (short)uVar6) {
          uVar10 = uVar6;
        }
        bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                ::count(iter->node);
        if ((iVar11 <= (int)((uint)bVar3 - (uint)uVar10)) ||
           (bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar8), (uint)bVar3 + (uint)uVar10 < 0x3d)) {
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::rebalance_left_to_right(iter->node,(uint)uVar10,pbVar8,(allocator_type *)this);
          iVar11 = iter->position;
          bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::count(iter->node);
          pbVar7 = iter->node;
          if ((int)(uint)bVar3 < iVar11) {
            iVar11 = iter->position;
            bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                    ::count(pbVar7);
            iter->position = ~(uint)bVar3 + iVar11;
            iter->node = pbVar8;
            pbVar7 = pbVar8;
          }
          bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::count(pbVar7);
          bVar4 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                  ::max_count(iter->node);
          if (bVar3 < bVar4) {
            return;
          }
          __assert_fail("node->count() < node->max_count()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x866,
                        "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                       );
        }
      }
    }
    fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::max_count(pbVar7);
    if (fVar1 != '=') {
      __assert_fail("parent->max_count() == kNodeValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x86e,
                    "void gtl::internal_btree::btree<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_or_split(iterator *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                   );
    }
    fVar1 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::count(pbVar7);
    if (fVar1 == '=') {
      pbVar8 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
               ::parent(iter->node);
      bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
              ::position(iter->node);
      parent_iter.position = (int)bVar3;
      parent_iter.node = pbVar8;
      rebalance_or_split(this,&parent_iter);
    }
  }
  bVar5 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::leaf(iter->node);
  if (bVar5) {
    dest = new_leaf_node(this,pbVar7);
    btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
    ::split(iter->node,iter->position,dest,(allocator_type *)this);
    if (this->rightmost_ == iter->node) {
      this->rightmost_ = dest;
    }
  }
  else {
    dest = new_internal_node(this,pbVar7);
    btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
    ::split(iter->node,iter->position,dest,(allocator_type *)this);
  }
  iVar11 = iter->position;
  bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          ::count(iter->node);
  if ((int)(uint)bVar3 < iVar11) {
    iVar11 = iter->position;
    bVar3 = btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::count(iter->node);
    iter->position = ~(uint)bVar3 + iVar11;
    iter->node = dest;
  }
  return;
}

Assistant:

void btree<P>::rebalance_or_split(iterator *iter) {
  node_type *&node = iter->node;
  int &insert_position = iter->position;
  assert(node->count() == node->max_count());
  assert(kNodeValues == node->max_count());

  // First try to make room on the node by rebalancing.
  node_type *parent = node->parent();
  if (node != root()) {
    if (node->position() > 0) {
      // Try rebalancing with our left sibling.
      node_type *left = parent->child(node->position() - 1);
      assert(left->max_count() == kNodeValues);
      if (left->count() < kNodeValues) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the end of the right node then we bias rebalancing to
        // fill up the left node.
        int to_move = (kNodeValues - left->count()) /
                      (1 + (insert_position < kNodeValues));
        to_move = std::max(1, to_move);

        if (((insert_position - to_move) >= 0) ||
            ((left->count() + to_move) < kNodeValues)) {
          left->rebalance_right_to_left(to_move, node, mutable_allocator());

          assert(node->max_count() - node->count() == to_move);
          insert_position = insert_position - to_move;
          if (insert_position < 0) {
            insert_position = insert_position + left->count() + 1;
            node = left;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    if (node->position() < parent->count()) {
      // Try rebalancing with our right sibling.
      node_type *right = parent->child(node->position() + 1);
      assert(right->max_count() == kNodeValues);
      if (right->count() < kNodeValues) {
        // We bias rebalancing based on the position being inserted. If we're
        // inserting at the beginning of the left node then we bias rebalancing
        // to fill up the right node.
        int to_move =
            (kNodeValues - right->count()) / (1 + (insert_position > 0));
        to_move = std::max(1, to_move);

        if ((insert_position <= (node->count() - to_move)) ||
            ((right->count() + to_move) < kNodeValues)) {
          node->rebalance_left_to_right(to_move, right, mutable_allocator());

          if (insert_position > node->count()) {
            insert_position = insert_position - node->count() - 1;
            node = right;
          }

          assert(node->count() < node->max_count());
          return;
        }
      }
    }

    // Rebalancing failed, make sure there is room on the parent node for a new
    // value.
    assert(parent->max_count() == kNodeValues);
    if (parent->count() == kNodeValues) {
      iterator parent_iter(node->parent(), node->position());
      rebalance_or_split(&parent_iter);
    }
  } else {
    // Rebalancing not possible because this is the root node.
    // Create a new root node and set the current root node as the child of the
    // new root.
    parent = new_internal_node(parent);
    parent->init_child(0, root());
    mutable_root() = parent;
    // If the former root was a leaf node, then it's now the rightmost node.
    assert(!parent->child(0)->leaf() || parent->child(0) == rightmost_);
  }

  // Split the node.
  node_type *split_node;
  if (node->leaf()) {
    split_node = new_leaf_node(parent);
    node->split(insert_position, split_node, mutable_allocator());
    if (rightmost_ == node) rightmost_ = split_node;
  } else {
    split_node = new_internal_node(parent);
    node->split(insert_position, split_node, mutable_allocator());
  }

  if (insert_position > node->count()) {
    insert_position = insert_position - node->count() - 1;
    node = split_node;
  }
}